

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

char * httplib::detail::find_content_type(string *path)

{
  bool bVar1;
  undefined1 local_38 [8];
  string ext;
  string *path_local;
  
  ext.field_2._8_8_ = path;
  file_extension((string *)local_38,path);
  bVar1 = std::operator==((string *)local_38,"txt");
  if (bVar1) {
    path_local = (string *)anon_var_dwarf_36cb9;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"html");
    if (bVar1) {
      path_local = (string *)anon_var_dwarf_3726b;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"css");
      if (bVar1) {
        path_local = (string *)anon_var_dwarf_37285;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"jpeg");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"jpg");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"png");
            if (bVar1) {
              path_local = (string *)anon_var_dwarf_372c6;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"gif");
              if (bVar1) {
                path_local = (string *)anon_var_dwarf_372e0;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,"svg");
                if (bVar1) {
                  path_local = (string *)anon_var_dwarf_372fa;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"ico");
                  if (bVar1) {
                    path_local = (string *)anon_var_dwarf_37314;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"json");
                    if (bVar1) {
                      path_local = (string *)anon_var_dwarf_3732e;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"pdf");
                      if (bVar1) {
                        path_local = (string *)anon_var_dwarf_37348;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_38,"js");
                        if (bVar1) {
                          path_local = (string *)anon_var_dwarf_37362;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"xml");
                          if (bVar1) {
                            path_local = (string *)anon_var_dwarf_3737c;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_38,"xhtml");
                            if (bVar1) {
                              path_local = (string *)anon_var_dwarf_37396;
                            }
                            else {
                              path_local = (string *)0x0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00205f37;
          }
        }
        path_local = (string *)anon_var_dwarf_372ac;
      }
    }
  }
LAB_00205f37:
  std::__cxx11::string::~string((string *)local_38);
  return (char *)path_local;
}

Assistant:

inline const char* find_content_type(const std::string& path)
{
    auto ext = file_extension(path);
    if (ext == "txt") {
        return "text/plain";
    } else if (ext == "html") {
        return "text/html";
    } else if (ext == "css") {
        return "text/css";
    } else if (ext == "jpeg" || ext == "jpg") {
        return "image/jpg";
    } else if (ext == "png") {
        return "image/png";
    } else if (ext == "gif") {
        return "image/gif";
    } else if (ext == "svg") {
        return "image/svg+xml";
    } else if (ext == "ico") {
        return "image/x-icon";
    } else if (ext == "json") {
        return "application/json";
    } else if (ext == "pdf") {
        return "application/pdf";
    } else if (ext == "js") {
        return "application/javascript";
    } else if (ext == "xml") {
        return "application/xml";
    } else if (ext == "xhtml") {
        return "application/xhtml+xml";
    }
    return nullptr;
}